

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O0

void __thiscall
ScriptUtil_GetP2shLockingScriptTest_Test::TestBody(ScriptUtil_GetP2shLockingScriptTest_Test *this)

{
  allocator<ScriptUtil_ScriptTestVector> *this_00;
  initializer_list<ScriptUtil_ScriptTestVector> __l;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ScriptUtil_ScriptTestVector *local_4d8;
  AssertHelper local_458;
  Message local_450;
  string local_448 [32];
  string local_428 [32];
  undefined1 local_408 [8];
  AssertionResult gtest_ar_1;
  Message local_3f0;
  Script local_3e8;
  undefined1 local_3b0 [8];
  ByteData160 script_hash;
  string local_368 [32];
  undefined1 local_348 [8];
  AssertionResult gtest_ar;
  Message local_330 [2];
  Script local_320;
  reference local_2e8;
  ScriptUtil_ScriptTestVector *test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_> *__range1;
  Script actual;
  string local_288 [39];
  allocator local_261;
  string local_260 [38];
  undefined1 local_23a;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [38];
  undefined1 local_1ea;
  allocator local_1e9;
  string local_1e8 [55];
  allocator local_1b1;
  string local_1b0 [32];
  ScriptUtil_ScriptTestVector *local_190;
  ScriptUtil_ScriptTestVector local_188;
  Script local_118;
  Script SStack_e0;
  Script local_a8;
  Script SStack_70;
  iterator local_38;
  pointer local_30;
  vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_> test_vectors;
  ScriptUtil_GetP2shLockingScriptTest_Test *this_local;
  
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  local_190 = &local_188;
  test_vectors.
  super__Vector_base<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b0,"01000111022222033333330244440155026666037777770288880199",&local_1b1);
  cfd::core::Script::Script(&local_188.input_redeem_script,local_1b0);
  local_1ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e8,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487",&local_1e9);
  cfd::core::Script::Script(&local_188.expect_locking_script,local_1e8);
  local_1ea = 0;
  local_190 = (ScriptUtil_ScriptTestVector *)&local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_210,"76a914edaf2414751239b72b653ea004adc310a3522e3788ac",&local_211);
  cfd::core::Script::Script(&local_118,local_210);
  local_23a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_238,"a914fc3ddf7d4677ad022910dabd15c1fd14f5e7a15b87",&local_239);
  cfd::core::Script::Script(&SStack_e0,local_238);
  local_23a = 0;
  local_190 = (ScriptUtil_ScriptTestVector *)&local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"0014edaf2414751239b72b653ea004adc310a3522e37",&local_261);
  cfd::core::Script::Script(&local_a8,local_260);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_288,"a91430cf0c44f55fe85b110d6bcdc771f1866c1f506f87",
             (allocator *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script(&SStack_70,local_288);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  local_38 = &local_188;
  local_30 = (pointer)0x3;
  this_00 = (allocator<ScriptUtil_ScriptTestVector> *)
            ((long)&actual.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::allocator<ScriptUtil_ScriptTestVector>::allocator(this_00);
  __l._M_len = (size_type)local_30;
  __l._M_array = local_38;
  std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>::vector
            ((vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_> *)
             &stack0xffffffffffffffd8,__l,this_00);
  std::allocator<ScriptUtil_ScriptTestVector>::~allocator
            ((allocator<ScriptUtil_ScriptTestVector> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_4d8 = (ScriptUtil_ScriptTestVector *)&stack0xffffffffffffffc8;
  do {
    local_4d8 = local_4d8 + -1;
    ScriptUtil_ScriptTestVector::~ScriptUtil_ScriptTestVector(local_4d8);
  } while (local_4d8 != &local_188);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  cfd::core::Script::Script((Script *)&__range1);
  __end1 = std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>::
           begin((vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>
                  *)&stack0xffffffffffffffd8);
  test_vector = (ScriptUtil_ScriptTestVector *)
                std::
                vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>::
                end((vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>
                     *)&stack0xffffffffffffffd8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_ScriptUtil_ScriptTestVector_*,_std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>_>
                                     *)&test_vector), bVar1) {
    local_2e8 = __gnu_cxx::
                __normal_iterator<const_ScriptUtil_ScriptTestVector_*,_std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>_>
                ::operator*(&__end1);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ScriptUtil::CreateP2shLockingScript(&local_320);
        cfd::core::Script::operator=((Script *)&__range1,&local_320);
        cfd::core::Script::~Script(&local_320);
      }
    }
    else {
      testing::Message::Message(local_330);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x82,
                 "Expected: (actual = ScriptUtil::CreateP2shLockingScript(test_vector.input_redeem_script)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_330);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_330);
    }
    cfd::core::Script::GetHex_abi_cxx11_();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_348,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc78);
    std::__cxx11::string::~string(local_368);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffc70);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &script_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x83,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &script_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Message *)&stack0xfffffffffffffc70);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &script_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message((Message *)&stack0xfffffffffffffc70);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
    cfd::core::HashUtil::Hash160((Script *)local_3b0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ScriptUtil::CreateP2shLockingScript((ByteData160 *)&local_3e8);
        cfd::core::Script::operator=((Script *)&__range1,&local_3e8);
        cfd::core::Script::~Script(&local_3e8);
      }
    }
    else {
      testing::Message::Message(&local_3f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x85,
                 "Expected: (actual = ScriptUtil::CreateP2shLockingScript(script_hash)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_3f0);
    }
    cfd::core::Script::GetHex_abi_cxx11_();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_408,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::~string(local_428);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
    if (!bVar1) {
      testing::Message::Message(&local_450);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
      testing::internal::AssertHelper::AssertHelper
                (&local_458,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x86,pcVar2);
      testing::internal::AssertHelper::operator=(&local_458,&local_450);
      testing::internal::AssertHelper::~AssertHelper(&local_458);
      testing::Message::~Message(&local_450);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
    cfd::core::ByteData160::~ByteData160((ByteData160 *)local_3b0);
    __gnu_cxx::
    __normal_iterator<const_ScriptUtil_ScriptTestVector_*,_std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>_>
    ::operator++(&__end1);
  }
  cfd::core::Script::~Script((Script *)&__range1);
  std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>::~vector
            ((vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_> *)
             &stack0xffffffffffffffd8);
  return;
}

Assistant:

TEST(ScriptUtil, GetP2shLockingScriptTest) {
  const std::vector<ScriptUtil_ScriptTestVector> test_vectors = {
    {
      // 00 11 2222 333333 4444 55 6666 777777 8888 99
      Script("01000111022222033333330244440155026666037777770288880199"),
      Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487")
    },
    {
      // p2pkh locking script
      Script("76a914edaf2414751239b72b653ea004adc310a3522e3788ac"),
      Script("a914fc3ddf7d4677ad022910dabd15c1fd14f5e7a15b87")
    },
    {
      // p2wpkh locking script
      Script("0014edaf2414751239b72b653ea004adc310a3522e37"),
      Script("a91430cf0c44f55fe85b110d6bcdc771f1866c1f506f87")
    },
  };

  Script actual;
  for (const ScriptUtil_ScriptTestVector& test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2shLockingScript(test_vector.input_redeem_script)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
    ByteData160 script_hash = HashUtil::Hash160(test_vector.input_redeem_script);
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2shLockingScript(script_hash)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
  }
}